

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

bool __thiscall google::protobuf::compiler::php::IsReservedName(php *this,string_view name)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  string lower;
  Nonnull<char_*> local_40;
  undefined8 local_38;
  char local_30;
  undefined7 uStack_2f;
  
  local_38 = 0;
  local_30 = '\0';
  local_40 = &local_30;
  std::__cxx11::string::resize((ulong)&local_40,(char)this);
  absl::lts_20250127::ascii_internal::AsciiStrToLower
            (local_40,(Nullable<const_char_*>)name._M_len,(size_t)this);
  iVar2 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar2 == 0) {
    bVar4 = true;
  }
  else {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 0x4f) break;
      iVar2 = std::__cxx11::string::compare((char *)&local_40);
      uVar1 = uVar3 + 1;
    } while (iVar2 != 0);
    bVar4 = uVar3 < 0x4f;
  }
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  return bVar4;
}

Assistant:

bool IsReservedName(absl::string_view name) {
  std::string lower = absl::AsciiStrToLower(name);
  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      return true;
    }
  }
  return false;
}